

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcb_openssl.cpp
# Opt level: O0

void __thiscall MCrypto::Backend::Backend(Backend *this,AES_TYPE bits,MODE mode)

{
  InternalData *this_00;
  char *pcVar1;
  QByteArray *a1;
  QMetaEnum local_c0;
  QByteArray local_b0;
  QByteArray local_98;
  QMetaEnum local_80;
  QByteArray local_70;
  QByteArray local_58;
  QByteArray local_40;
  MODE local_18;
  AES_TYPE local_14;
  MODE mode_local;
  AES_TYPE bits_local;
  Backend *this_local;
  
  local_18 = mode;
  local_14 = bits;
  _mode_local = this;
  this_00 = (InternalData *)operator_new(0x70);
  InternalData::InternalData(this_00);
  this->m = this_00;
  local_80 = QMetaEnum::fromType<MCrypto::AES_TYPE>();
  pcVar1 = (char *)QMetaEnum::valueToKey((int)&local_80);
  QByteArray::QByteArray(&local_70,pcVar1,-1);
  a1 = (QByteArray *)QByteArray::replace((char)&local_70,'_');
  QByteArray::QByteArray(&local_98,"-",-1);
  operator+(&local_58,a1,&local_98);
  local_c0 = QMetaEnum::fromType<MCrypto::MODE>();
  pcVar1 = (char *)QMetaEnum::valueToKey((int)&local_c0);
  QByteArray::QByteArray(&local_b0,pcVar1,-1);
  operator+(&local_40,&local_58,&local_b0);
  QByteArray::operator=(&this->m->algorithm,&local_40);
  QByteArray::~QByteArray(&local_40);
  QByteArray::~QByteArray(&local_b0);
  QByteArray::~QByteArray(&local_58);
  QByteArray::~QByteArray(&local_98);
  QByteArray::~QByteArray(&local_70);
  return;
}

Assistant:

MCrypto::Backend::Backend(MCrypto::AES_TYPE bits, MCrypto::MODE mode)
{
    m = new InternalData;
    m->algorithm = QByteArray(QMetaEnum::fromType<MCrypto::AES_TYPE>()
                                 .valueToKey(int(bits))).replace('_', '-')
                  + QByteArray("-")
                  + QByteArray(QMetaEnum::fromType<MCrypto::MODE>().valueToKey(int(mode)));
}